

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O3

void __thiscall
slang::ast::Expression::getLongestStaticPrefixes
          (Expression *this,
          SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
          *results,EvalContext *evalContext,Expression *longestStaticPrefix)

{
  ExpressionKind EVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  bool bVar4;
  long lVar5;
  
  while( true ) {
    EVar1 = (((RangeSelectExpression *)this)->super_Expression).kind;
    if (EVar1 != Conversion) {
      switch(EVar1) {
      case NamedValue:
      case HierarchicalValue:
        ValueExpressionBase::getLongestStaticPrefixesImpl
                  ((ValueExpressionBase *)this,results,longestStaticPrefix);
        return;
      case Concatenation:
        bVar4 = Type::isIntegral((((RangeSelectExpression *)this)->super_Expression).type.ptr);
        if ((bVar4) &&
           (pEVar2 = ((RangeSelectExpression *)this)->left_, pEVar2 != (Expression *)0x0)) {
          pEVar3 = ((RangeSelectExpression *)this)->value_;
          lVar5 = 0;
          do {
            getLongestStaticPrefixes
                      (*(Expression **)((long)&pEVar3->kind + lVar5),results,evalContext,
                       (Expression *)0x0);
            lVar5 = lVar5 + 8;
          } while ((long)pEVar2 << 3 != lVar5);
        }
        break;
      case Streaming:
        pEVar2 = ((RangeSelectExpression *)this)->left_;
        if (pEVar2 != (Expression *)0x0) {
          pEVar3 = ((RangeSelectExpression *)this)->value_;
          lVar5 = 0;
          do {
            getLongestStaticPrefixes
                      (*(Expression **)((long)&pEVar3->kind + lVar5),results,evalContext,
                       (Expression *)0x0);
            lVar5 = lVar5 + 0x18;
          } while ((long)pEVar2 * 0x18 != lVar5);
        }
        break;
      case ElementSelect:
        ElementSelectExpression::getLongestStaticPrefixesImpl
                  ((ElementSelectExpression *)this,results,evalContext,longestStaticPrefix);
        return;
      case RangeSelect:
        RangeSelectExpression::getLongestStaticPrefixesImpl
                  ((RangeSelectExpression *)this,results,evalContext,longestStaticPrefix);
        return;
      case MemberAccess:
        MemberAccessExpression::getLongestStaticPrefixesImpl
                  ((MemberAccessExpression *)this,results,evalContext,longestStaticPrefix);
        return;
      }
      return;
    }
    if (1 < *(int *)&((RangeSelectExpression *)this)->value_) break;
    this = ((RangeSelectExpression *)this)->left_;
  }
  return;
}

Assistant:

void Expression::getLongestStaticPrefixes(
    SmallVector<std::pair<const ValueSymbol*, const Expression*>>& results,
    EvalContext& evalContext, const Expression* longestStaticPrefix) const {

    switch (kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue: {
            auto& ve = as<ValueExpressionBase>();
            ve.getLongestStaticPrefixesImpl(results, longestStaticPrefix);
            break;
        }
        case ExpressionKind::ElementSelect: {
            auto& select = as<ElementSelectExpression>();
            select.getLongestStaticPrefixesImpl(results, evalContext, longestStaticPrefix);
            break;
        }
        case ExpressionKind::RangeSelect: {
            auto& select = as<RangeSelectExpression>();
            select.getLongestStaticPrefixesImpl(results, evalContext, longestStaticPrefix);
            break;
        }
        case ExpressionKind::MemberAccess: {
            auto& access = as<MemberAccessExpression>();
            access.getLongestStaticPrefixesImpl(results, evalContext, longestStaticPrefix);
            break;
        }
        case ExpressionKind::Concatenation: {
            auto& concat = as<ConcatenationExpression>();
            if (concat.type->isIntegral()) {
                for (auto op : concat.operands())
                    op->getLongestStaticPrefixes(results, evalContext, nullptr);
            }
            break;
        }
        case ExpressionKind::Streaming: {
            SLANG_ASSERT(!longestStaticPrefix);
            auto& stream = as<StreamingConcatenationExpression>();
            for (auto& op : stream.streams())
                op.operand->getLongestStaticPrefixes(results, evalContext, nullptr);
            break;
        }
        case ExpressionKind::Conversion: {
            auto& conv = as<ConversionExpression>();
            if (conv.isImplicit())
                conv.operand().getLongestStaticPrefixes(results, evalContext, longestStaticPrefix);
            break;
        }
        case ExpressionKind::Invalid:
        default:
            break;
    }
}